

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O0

void TTD::NSSnapType::ParseSnapPropertyRecord
               (SnapPropertyRecord *sRecord,bool readSeparator,FileReader *reader,
               SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  bool readSeparator_local;
  SnapPropertyRecord *sRecord_local;
  
  (*reader->_vptr_FileReader[6])
            (reader,(ulong)readSeparator & 1,reader,
             CONCAT71((int7)((ulong)alloc >> 8),readSeparator) & 0xffffffffffffff01);
  uVar1 = FileReader::ReadUInt32(reader,propertyId,false);
  sRecord->PropertyId = uVar1;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,0x54,1);
  sRecord->IsNumeric = (bool)((byte)iVar2 & 1);
  iVar2 = (*reader->_vptr_FileReader[10])(reader,0x53,1);
  sRecord->IsBound = (bool)((byte)iVar2 & 1);
  iVar2 = (*reader->_vptr_FileReader[10])(reader,0x55,1);
  sRecord->IsSymbol = (bool)((byte)iVar2 & 1);
  FileReader::ReadString<TTD::SlabAllocatorBase<0>>(reader,name,alloc,&sRecord->PropertyName,true);
  (*reader->_vptr_FileReader[7])();
  return;
}

Assistant:

void ParseSnapPropertyRecord(SnapPropertyRecord* sRecord, bool readSeparator, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);

            sRecord->PropertyId = reader->ReadUInt32(NSTokens::Key::propertyId);

            sRecord->IsNumeric = reader->ReadBool(NSTokens::Key::isNumeric, true);
            sRecord->IsBound = reader->ReadBool(NSTokens::Key::isBound, true);
            sRecord->IsSymbol = reader->ReadBool(NSTokens::Key::isSymbol, true);

            reader->ReadString(NSTokens::Key::name, alloc, sRecord->PropertyName, true);

            reader->ReadRecordEnd();
        }